

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum-dtoa.cc
# Opt level: O3

void __thiscall
double_conversion::BignumDtoa
          (double_conversion *this,double v,BignumDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  long lVar1;
  double dVar2;
  uint16_t uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  BignumDtoaMode BVar8;
  byte *pbVar9;
  byte bVar10;
  uint uVar11;
  undefined4 in_register_00000014;
  char *pcVar12;
  ulong uVar13;
  ulong factor;
  uint uVar14;
  Bignum *pBVar15;
  int *piVar16;
  uint uVar17;
  bool bVar18;
  bool bVar19;
  float fVar20;
  Vector<char> buffer_00;
  Bignum denominator;
  Bignum numerator;
  Bignum delta_plus;
  Bignum delta_minus;
  undefined4 in_stack_fffffffffffff798;
  Bignum local_840;
  Bignum local_63c;
  Bignum local_438;
  Bignum local_234;
  
  pcVar12 = (char *)CONCAT44(in_register_00000014,requested_digits);
  piVar16 = buffer._8_8_;
  uVar14 = (uint)this;
  if (uVar14 == 1) {
    fVar20 = (float)v;
    uVar11 = (uint)fVar20 & 0x7fffff;
    bVar18 = ((uint)fVar20 & 0x7f800000) == 0;
    uVar17 = uVar11 + 0x800000;
    if (bVar18) {
      uVar17 = uVar11;
    }
    factor = (ulong)uVar17;
    iVar5 = -0x95;
    if (!bVar18) {
      iVar5 = ((uint)fVar20 >> 0x17 & 0xff) - 0x96;
    }
    bVar18 = uVar11 == 0;
    bVar19 = ((uint)fVar20 & 0x7f000000) == 0;
  }
  else {
    uVar13 = (ulong)v & 0xfffffffffffff;
    bVar18 = ((ulong)v & 0x7ff0000000000000) == 0;
    factor = uVar13 + 0x10000000000000;
    if (bVar18) {
      factor = uVar13;
    }
    iVar5 = -0x432;
    if (!bVar18) {
      iVar5 = ((uint)((ulong)v >> 0x34) & 0x7ff) - 0x433;
    }
    bVar18 = uVar13 == 0;
    bVar19 = ((ulong)v & 0x7fe0000000000000) == 0;
  }
  lVar1 = 0x3f;
  if ((factor & 0xfffffffffffff) != 0) {
    for (; (factor & 0xfffffffffffff) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  iVar4 = (iVar5 + 0xb) - ((uint)lVar1 ^ 0x3f);
  if ((factor & 0x10000000000000) != 0) {
    iVar4 = iVar5;
  }
  dVar2 = ceil((double)(iVar4 + 0x34) * 0.30102999566398114 + -1e-10);
  uVar17 = (uint)dVar2;
  if ((uVar14 == 2) && ((int)mode < (int)~uVar17)) {
    *pcVar12 = '\0';
    *piVar16 = 0;
    *length = -mode;
    return;
  }
  local_63c.used_bigits_ = 0;
  local_63c.exponent_ = 0;
  local_840.used_bigits_ = 0;
  local_840.exponent_ = 0;
  local_234.used_bigits_ = 0;
  local_234.exponent_ = 0;
  local_438.used_bigits_ = 0;
  local_438.exponent_ = 0;
  if (iVar5 < 0) {
    if ((int)uVar17 < 0) {
      Bignum::AssignPowerUInt16(&local_63c,10,-uVar17);
      if (uVar14 < 2) {
        Bignum::AssignBignum(&local_438,&local_63c);
        Bignum::AssignBignum(&local_234,&local_63c);
        Bignum::MultiplyByUInt64(&local_63c,factor);
        Bignum::AssignUInt16(&local_840,1);
        Bignum::ShiftLeft(&local_840,-iVar5);
        Bignum::ShiftLeft(&local_63c,1);
        iVar5 = 1;
      }
      else {
        Bignum::MultiplyByUInt64(&local_63c,factor);
        Bignum::AssignUInt16(&local_840,1);
        iVar5 = -iVar5;
      }
      pBVar15 = &local_840;
      goto LAB_005f5b5b;
    }
    Bignum::AssignUInt64(&local_63c,factor);
    Bignum::AssignPowerUInt16(&local_840,10,uVar17);
    Bignum::ShiftLeft(&local_840,-iVar5);
    if (1 < uVar14) goto LAB_005f5ba3;
    Bignum::ShiftLeft(&local_840,1);
    Bignum::ShiftLeft(&local_63c,1);
    Bignum::AssignUInt16(&local_438,1);
    Bignum::AssignUInt16(&local_234,1);
LAB_005f5b60:
    if (!(bool)(!bVar19 & bVar18 ^ 1U | 1 < uVar14)) {
      Bignum::ShiftLeft(&local_840,1);
      Bignum::ShiftLeft(&local_63c,1);
      Bignum::ShiftLeft(&local_438,1);
    }
  }
  else {
    Bignum::AssignUInt64(&local_63c,factor);
    Bignum::ShiftLeft(&local_63c,iVar5);
    Bignum::AssignPowerUInt16(&local_840,10,uVar17);
    if (uVar14 < 2) {
      Bignum::ShiftLeft(&local_840,1);
      Bignum::ShiftLeft(&local_63c,1);
      Bignum::AssignUInt16(&local_438,1);
      Bignum::ShiftLeft(&local_438,iVar5);
      pBVar15 = &local_234;
      Bignum::AssignUInt16(pBVar15,1);
LAB_005f5b5b:
      Bignum::ShiftLeft(pBVar15,iVar5);
      goto LAB_005f5b60;
    }
  }
LAB_005f5ba3:
  iVar5 = Bignum::PlusCompare(&local_63c,&local_438,&local_840);
  if ((factor & 1) == 0) {
    if (iVar5 < 0) goto LAB_005f5bcb;
LAB_005f5c23:
    *length = uVar17 + 1;
  }
  else {
    if (0 < iVar5) goto LAB_005f5c23;
LAB_005f5bcb:
    *length = uVar17;
    Bignum::MultiplyByUInt32(&local_63c,10);
    iVar5 = Bignum::Compare(&local_234,&local_438);
    Bignum::MultiplyByUInt32(&local_234,10);
    if (iVar5 == 0) {
      Bignum::AssignBignum(&local_438,&local_234);
    }
    else {
      Bignum::MultiplyByUInt32(&local_438,10);
    }
  }
  if (uVar14 < 2) {
    iVar5 = Bignum::Compare(&local_234,&local_438);
    pBVar15 = &local_438;
    if (iVar5 == 0) {
      pBVar15 = &local_234;
    }
    *piVar16 = 0;
    uVar17 = (uint)factor & 1 ^ 1;
    uVar14 = (uint)((factor & 1) == 0);
    iVar4 = -uVar14;
    while( true ) {
      uVar3 = Bignum::DivideModuloIntBignum(&local_63c,&local_840);
      iVar6 = *piVar16;
      *piVar16 = iVar6 + 1;
      pcVar12[iVar6] = (char)uVar3 + '0';
      iVar6 = Bignum::Compare(&local_63c,&local_234);
      iVar7 = Bignum::PlusCompare(&local_63c,pBVar15,&local_840);
      if ((iVar6 < (int)uVar17) ||
         (iVar7 != iVar4 && SBORROW4(iVar7,iVar4) == (int)(iVar7 + uVar14) < 0)) break;
      Bignum::MultiplyByUInt32(&local_63c,10);
      Bignum::MultiplyByUInt32(&local_234,10);
      if (iVar5 != 0) {
        Bignum::MultiplyByUInt32(&local_438,10);
      }
    }
    if ((iVar6 < (int)uVar17) &&
       (iVar7 != iVar4 && SBORROW4(iVar7,iVar4) == (int)(iVar7 + uVar14) < 0)) {
      iVar5 = Bignum::PlusCompare(&local_63c,&local_63c,&local_840);
      if (iVar5 < 0) goto LAB_005f5e1e;
      pbVar9 = (byte *)(pcVar12 + (long)*piVar16 + -1);
      bVar10 = *pbVar9;
      if ((iVar5 == 0) && ((bVar10 & 1) == 0)) goto LAB_005f5e1e;
    }
    else {
      if (iVar6 < (int)uVar17) goto LAB_005f5e1e;
      pbVar9 = (byte *)(pcVar12 + (long)*piVar16 + -1);
      bVar10 = *pbVar9;
    }
    *pbVar9 = bVar10 + 1;
    goto LAB_005f5e1e;
  }
  if (uVar14 == 2) {
    BVar8 = -*length;
    if ((int)mode < (int)BVar8) {
      *length = -mode;
    }
    else {
      if (BVar8 != mode) {
        BVar8 = *length + mode;
        goto LAB_005f5c64;
      }
      Bignum::MultiplyByUInt32(&local_840,10);
      iVar5 = Bignum::PlusCompare(&local_63c,&local_63c,&local_840);
      if (-1 < iVar5) {
        *pcVar12 = '1';
        *piVar16 = 1;
        *length = *length + 1;
        goto LAB_005f5e1e;
      }
    }
    *piVar16 = 0;
  }
  else {
    BVar8 = mode;
    if (uVar14 != 3) {
      abort();
    }
LAB_005f5c64:
    buffer_00._8_8_ = piVar16;
    buffer_00.start_ = pcVar12;
    GenerateCountedDigits
              (BVar8,length,&local_63c,&local_840,buffer_00,
               (int *)CONCAT44(mode,in_stack_fffffffffffff798));
  }
LAB_005f5e1e:
  pcVar12[*piVar16] = '\0';
  return;
}

Assistant:

void BignumDtoa(double v, BignumDtoaMode mode, int requested_digits,
                Vector<char> buffer, int* length, int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(v > 0);
  DOUBLE_CONVERSION_ASSERT(!Double(v).IsSpecial());
  uint64_t significand;
  int exponent;
  bool lower_boundary_is_closer;
  if (mode == BIGNUM_DTOA_SHORTEST_SINGLE) {
    float f = static_cast<float>(v);
    DOUBLE_CONVERSION_ASSERT(f == v);
    significand = Single(f).Significand();
    exponent = Single(f).Exponent();
    lower_boundary_is_closer = Single(f).LowerBoundaryIsCloser();
  } else {
    significand = Double(v).Significand();
    exponent = Double(v).Exponent();
    lower_boundary_is_closer = Double(v).LowerBoundaryIsCloser();
  }
  bool need_boundary_deltas =
      (mode == BIGNUM_DTOA_SHORTEST || mode == BIGNUM_DTOA_SHORTEST_SINGLE);

  bool is_even = (significand & 1) == 0;
  int normalized_exponent = NormalizedExponent(significand, exponent);
  // estimated_power might be too low by 1.
  int estimated_power = EstimatePower(normalized_exponent);

  // Shortcut for Fixed.
  // The requested digits correspond to the digits after the point. If the
  // number is much too small, then there is no need in trying to get any
  // digits.
  if (mode == BIGNUM_DTOA_FIXED && -estimated_power - 1 > requested_digits) {
    buffer[0] = '\0';
    *length = 0;
    // Set decimal-point to -requested_digits. This is what Gay does.
    // Note that it should not have any effect anyways since the string is
    // empty.
    *decimal_point = -requested_digits;
    return;
  }

  Bignum numerator;
  Bignum denominator;
  Bignum delta_minus;
  Bignum delta_plus;
  // Make sure the bignum can grow large enough. The smallest double equals
  // 4e-324. In this case the denominator needs fewer than 324*4 binary digits.
  // The maximum double is 1.7976931348623157e308 which needs fewer than
  // 308*4 binary digits.
  DOUBLE_CONVERSION_ASSERT(Bignum::kMaxSignificantBits >= 324*4);
  InitialScaledStartValues(significand, exponent, lower_boundary_is_closer,
                           estimated_power, need_boundary_deltas,
                           &numerator, &denominator,
                           &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^estimated_power.
  FixupMultiply10(estimated_power, is_even, decimal_point,
                  &numerator, &denominator,
                  &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^(decimal_point-1), and
  //  1 <= (numerator + delta_plus) / denominator < 10
  switch (mode) {
    case BIGNUM_DTOA_SHORTEST:
    case BIGNUM_DTOA_SHORTEST_SINGLE:
      GenerateShortestDigits(&numerator, &denominator,
                             &delta_minus, &delta_plus,
                             is_even, buffer, length);
      break;
    case BIGNUM_DTOA_FIXED:
      BignumToFixed(requested_digits, decimal_point,
                    &numerator, &denominator,
                    buffer, length);
      break;
    case BIGNUM_DTOA_PRECISION:
      GenerateCountedDigits(requested_digits, decimal_point,
                            &numerator, &denominator,
                            buffer, length);
      break;
    default:
      DOUBLE_CONVERSION_UNREACHABLE();
  }
  buffer[*length] = '\0';
}